

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLatch.c
# Opt level: O0

Vec_Ptr_t * Abc_NtkConverLatchNamesIntoNumbers(Abc_Ntk_t *pNtk)

{
  int iVar1;
  uint uVar2;
  Abc_Obj_t *pAVar3;
  Vec_Ptr_t *p;
  Vec_Int_t *p_00;
  char *pName_00;
  Abc_Obj_t *pObj_00;
  int local_48;
  int Num;
  int k;
  int i;
  char *pName;
  Abc_Obj_t *pObj;
  Vec_Int_t *vNumbers;
  Vec_Ptr_t *vNames;
  Vec_Ptr_t *vResult;
  Abc_Ntk_t *pNtk_local;
  
  if (pNtk->vOnehots == (Vec_Ptr_t *)0x0) {
    pNtk_local = (Abc_Ntk_t *)0x0;
  }
  else {
    for (Num = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), Num < iVar1; Num = Num + 1) {
      pAVar3 = Abc_NtkBox(pNtk,Num);
      iVar1 = Abc_ObjIsLatch(pAVar3);
      if (iVar1 != 0) {
        pAVar3->pNext = (Abc_Obj_t *)(long)Num;
      }
    }
    iVar1 = Vec_PtrSize(pNtk->vOnehots);
    pNtk_local = (Abc_Ntk_t *)Vec_PtrAlloc(iVar1);
    for (Num = 0; iVar1 = Vec_PtrSize(pNtk->vOnehots), Num < iVar1; Num = Num + 1) {
      p = (Vec_Ptr_t *)Vec_PtrEntry(pNtk->vOnehots,Num);
      iVar1 = Vec_PtrSize(p);
      p_00 = Vec_IntAlloc(iVar1);
      for (local_48 = 0; iVar1 = Vec_PtrSize(p), local_48 < iVar1; local_48 = local_48 + 1) {
        pName_00 = (char *)Vec_PtrEntry(p,local_48);
        iVar1 = Nm_ManFindIdByName(pNtk->pManName,pName_00,5);
        if (-1 < iVar1) {
          pAVar3 = Abc_NtkObj(pNtk,iVar1);
          iVar1 = Abc_ObjFaninNum(pAVar3);
          if (iVar1 == 1) {
            pObj_00 = Abc_ObjFanin0(pAVar3);
            iVar1 = Abc_ObjIsLatch(pObj_00);
            if (iVar1 != 0) {
              Vec_IntPush(p_00,(int)pAVar3->pNext);
            }
          }
        }
      }
      iVar1 = Vec_IntSize(p_00);
      if (iVar1 < 2) {
        Vec_IntFree(p_00);
      }
      else {
        Vec_PtrPush((Vec_Ptr_t *)pNtk_local,p_00);
        uVar2 = Vec_IntSize(p_00);
        printf("Converted %d one-hot registers.\n",(ulong)uVar2);
      }
    }
    for (Num = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), Num < iVar1; Num = Num + 1) {
      pAVar3 = Abc_NtkBox(pNtk,Num);
      iVar1 = Abc_ObjIsLatch(pAVar3);
      if (iVar1 != 0) {
        pAVar3->pNext = (Abc_Obj_t *)0x0;
      }
    }
  }
  return (Vec_Ptr_t *)pNtk_local;
}

Assistant:

Vec_Ptr_t * Abc_NtkConverLatchNamesIntoNumbers( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vResult, * vNames;
    Vec_Int_t * vNumbers;
    Abc_Obj_t * pObj;
    char * pName;
    int i, k, Num;
    if ( pNtk->vOnehots == NULL )
        return NULL;
    // set register numbers
    Abc_NtkForEachLatch( pNtk, pObj, i )
        pObj->pNext = (Abc_Obj_t *)(ABC_PTRINT_T)i;
    // add the numbers
    vResult = Vec_PtrAlloc( Vec_PtrSize(pNtk->vOnehots) );
    Vec_PtrForEachEntry( Vec_Ptr_t *, pNtk->vOnehots, vNames, i )
    {
        vNumbers = Vec_IntAlloc( Vec_PtrSize(vNames) );
        Vec_PtrForEachEntry( char *, vNames, pName, k )
        {
            Num = Nm_ManFindIdByName( pNtk->pManName, pName, ABC_OBJ_BO );
            if ( Num < 0 )
                continue;
            pObj = Abc_NtkObj( pNtk, Num );
            if ( Abc_ObjFaninNum(pObj) != 1 || !Abc_ObjIsLatch(Abc_ObjFanin0(pObj)) )
                continue;
            Vec_IntPush( vNumbers, (int)(ABC_PTRINT_T)pObj->pNext );
        }
        if ( Vec_IntSize( vNumbers ) > 1 )
        {
            Vec_PtrPush( vResult, vNumbers );
printf( "Converted %d one-hot registers.\n", Vec_IntSize(vNumbers) );
        }
        else
            Vec_IntFree( vNumbers );
    }
    // clean the numbers
    Abc_NtkForEachLatch( pNtk, pObj, i )
        pObj->pNext = NULL;
    return vResult;
}